

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::BxDFHandle::rho
          (BxDFHandle *this,span<const_pbrt::Point2<float>_> u1,span<const_float> uc,
          span<const_pbrt::Point2<float>_> u2)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM4 [16];
  SampledSpectrum SVar12;
  optional<pbrt::BSDFSample> bs;
  DispatchSplit<10> local_f9;
  float local_f8;
  float local_f4;
  float local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  float local_e4;
  TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  local_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  Tuple2<pbrt::Point2,_float> local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a8 [16];
  undefined8 *local_90;
  float *pfStack_88;
  Tuple2<pbrt::Point2,_float> *pTStack_80;
  undefined4 *puStack_78;
  undefined4 *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined4 local_50;
  float local_4c;
  char local_3c;
  
  sVar2 = uc.n;
  if (sVar2 == 0) {
    local_d8 = 0.0;
    fStack_d4 = 0.0;
    fStack_d0 = 0.0;
    fStack_cc = 0.0;
  }
  else {
    local_d8 = 0.0;
    fStack_d4 = 0.0;
    fStack_d0 = 0.0;
    fStack_cc = 0.0;
    sVar3 = 0;
    do {
      fVar5 = u1.ptr[sVar3].super_Tuple2<pbrt::Point2,_float>.x;
      local_a8 = ZEXT416((uint)fVar5);
      auVar8._0_12_ = ZEXT812(0);
      auVar8._12_4_ = 0;
      auVar8 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar5 * fVar5)),auVar8);
      if (auVar8._0_4_ < 0.0) {
        local_f8 = sqrtf(auVar8._0_4_);
      }
      else {
        auVar8 = vsqrtss_avx(auVar8,auVar8);
        local_f8 = auVar8._0_4_;
      }
      local_f0 = u1.ptr[sVar3].super_Tuple2<pbrt::Point2,_float>.y * 6.2831855;
      local_f4 = cosf(local_f0);
      fVar5 = sinf(local_f0);
      if (((float)local_a8._0_4_ != 0.0) || (NAN((float)local_a8._0_4_))) {
        auVar8 = vinsertps_avx(ZEXT416((uint)(local_f8 * local_f4)),
                               ZEXT416((uint)(local_f8 * fVar5)),0x10);
        local_e4 = uc.ptr[sVar3];
        local_c0 = u2.ptr[sVar3].super_Tuple2<pbrt::Point2,_float>;
        local_b8 = vmovlps_avx(auVar8);
        local_b0 = (float)local_a8._0_4_;
        local_e8 = 0;
        local_ec = 3;
        local_90 = &local_b8;
        pfStack_88 = &local_e4;
        pTStack_80 = &local_c0;
        puStack_78 = &local_e8;
        local_70 = &local_ec;
        local_e0.bits =
             (this->
             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
             ).bits;
        DispatchSplit<10>::operator()(&local_68,&local_f9,&local_e0,local_e0.bits >> 0x30);
        if (local_3c == '\x01') {
          auVar11._8_4_ = 0x7fffffff;
          auVar11._0_8_ = 0x7fffffff7fffffff;
          auVar11._12_4_ = 0x7fffffff;
          auVar4._4_4_ = local_50;
          auVar4._0_4_ = local_50;
          auVar4._8_4_ = local_50;
          auVar4._12_4_ = local_50;
          auVar4 = vandps_avx512vl(auVar11,auVar4);
          auVar9._4_4_ = local_a8._0_4_;
          auVar9._0_4_ = local_a8._0_4_;
          auVar9._8_4_ = local_a8._0_4_;
          auVar9._12_4_ = local_a8._0_4_;
          auVar8 = vandps_avx(auVar9,auVar11);
          auVar6._0_4_ = auVar8._0_4_ * auVar4._0_4_ * local_68;
          auVar6._4_4_ = auVar8._4_4_ * auVar4._4_4_ * fStack_64;
          auVar6._8_4_ = auVar8._8_4_ * auVar4._8_4_ * fStack_60;
          auVar6._12_4_ = auVar8._12_4_ * auVar4._12_4_ * fStack_5c;
          fVar5 = local_4c * 0.15915494;
          auVar10._4_4_ = fVar5;
          auVar10._0_4_ = fVar5;
          auVar10._8_4_ = fVar5;
          auVar10._12_4_ = fVar5;
          auVar8 = vdivps_avx(auVar6,auVar10);
          local_d8 = auVar8._0_4_ + local_d8;
          fStack_d4 = auVar8._4_4_ + fStack_d4;
          fStack_d0 = auVar8._8_4_ + fStack_d0;
          fStack_cc = auVar8._12_4_ + fStack_cc;
          local_3c = '\0';
        }
      }
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  auVar8 = vcvtusi2ss_avx512f(in_XMM4,sVar2);
  fVar5 = auVar8._0_4_ * 3.1415927;
  auVar7._4_4_ = fVar5;
  auVar7._0_4_ = fVar5;
  auVar7._8_4_ = fVar5;
  auVar7._12_4_ = fVar5;
  auVar1._4_4_ = fStack_d4;
  auVar1._0_4_ = local_d8;
  auVar1._8_4_ = fStack_d0;
  auVar1._12_4_ = fStack_cc;
  auVar8 = vdivps_avx(auVar1,auVar7);
  auVar4 = vshufpd_avx(auVar8,auVar8,1);
  SVar12.values.values._0_8_ = auVar8._0_8_;
  SVar12.values.values._8_8_ = auVar4._0_8_;
  return (SampledSpectrum)SVar12.values.values;
}

Assistant:

SampledSpectrum BxDFHandle::rho(pstd::span<const Point2f> u1, pstd::span<const Float> uc,
                                pstd::span<const Point2f> u2) const {
    DCHECK_EQ(uc.size(), u1.size());
    DCHECK_EQ(u1.size(), u2.size());
    SampledSpectrum r(0.f);
    for (size_t i = 0; i < uc.size(); ++i) {
        // Compute estimate of of $\rho_\roman{hh}$
        Vector3f wo = SampleUniformHemisphere(u1[i]);
        if (wo.z == 0)
            continue;
        Float pdfo = UniformHemispherePDF();
        pstd::optional<BSDFSample> bs = Sample_f(wo, uc[i], u2[i]);
        if (bs)
            r += bs->f * AbsCosTheta(bs->wi) * AbsCosTheta(wo) / (pdfo * bs->pdf);
    }
    return r / (Pi * uc.size());
}